

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.hpp
# Opt level: O1

string * webfront::websocket::getHashedSecKey(string *__return_storage_ptr__,string *key)

{
  pointer pcVar1;
  long lVar2;
  uint uVar3;
  char *in_RCX;
  string_view input;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  uint local_68 [6];
  array<unsigned_int,_5UL> local_50;
  detail local_38 [8];
  uint auStack_30 [2];
  uint local_28;
  
  pcVar1 = (key->_M_dataplus)._M_p;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar1,pcVar1 + key->_M_string_length);
  http::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_88,"258EAFA5-E914-47DA-95CA-C5AB0DC85B11");
  input._M_str = in_RCX;
  input._M_len = (size_t)local_88._M_dataplus._M_p;
  crypto::sha1(&local_50,(crypto *)local_88._M_string_length,input);
  local_68[4] = local_50._M_elems[4];
  local_68[0] = local_50._M_elems[0];
  local_68[1] = local_50._M_elems[1];
  local_68[2] = local_50._M_elems[2];
  local_68[3] = local_50._M_elems[3];
  lVar2 = 0;
  do {
    uVar3 = *(uint *)((long)local_68 + lVar2);
    uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    *(uint *)((long)local_68 + lVar2) = uVar3;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x14);
  local_28 = local_68[4];
  local_38 = (detail  [8])local_68._0_8_;
  auStack_30[0] = local_68[2];
  auStack_30[1] = local_68[3];
  base64::detail::encode_abi_cxx11_(__return_storage_ptr__,local_38,(uint8_t *)0x14,(ulong)uVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] inline std::string getHashedSecKey(std::string key) {
    constexpr auto rfc6455Guid = "258EAFA5-E914-47DA-95CA-C5AB0DC85B11";
    return base64::encodeInNetworkOrder(crypto::sha1(key + rfc6455Guid));
}